

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward_int8(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined1 uVar2;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined4 uVar9;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined4 uVar17;
  undefined1 uVar18;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined8 uVar25;
  int *piVar32;
  int k;
  Mat local_100;
  Option opt_g;
  vector<int,_std::allocator<int>_> _space_ofs;
  undefined4 uVar3;
  undefined3 uVar5;
  undefined2 uVar7;
  undefined4 uVar11;
  undefined3 uVar13;
  undefined2 uVar15;
  undefined4 uVar19;
  undefined3 uVar21;
  undefined2 uVar23;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined3 uVar28;
  undefined1 uVar29;
  undefined2 uVar30;
  undefined1 uVar31;
  
  local_100.c = bottom_blob->c;
  local_100.elemsize = bottom_blob->elemsize;
  local_100.data = bottom_blob->data;
  local_100.refcount = bottom_blob->refcount;
  local_100.elempack = bottom_blob->elempack;
  local_100.allocator = bottom_blob->allocator;
  local_100.dims = bottom_blob->dims;
  local_100.w = bottom_blob->w;
  local_100.h = bottom_blob->h;
  local_100.d = bottom_blob->d;
  local_100.cstep = bottom_blob->cstep;
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + 1;
    UNLOCK();
  }
  if (local_100.elemsize != 1) {
    opt_g.lightmode = opt->lightmode;
    opt_g.use_shader_pack8 = opt->use_shader_pack8;
    opt_g.use_subgroup_ops = opt->use_subgroup_ops;
    opt_g.use_reserved_0 = opt->use_reserved_0;
    opt_g.num_threads = opt->num_threads;
    uVar1 = opt->openmp_blocktime;
    uVar2 = opt->use_winograd_convolution;
    uVar4 = opt->use_sgemm_convolution;
    uVar6 = opt->use_int8_inference;
    uVar8 = opt->use_vulkan_compute;
    uVar7 = CONCAT11(uVar8,uVar6);
    uVar5 = CONCAT21(uVar7,uVar4);
    uVar3 = CONCAT31(uVar5,uVar2);
    opt_g.use_bf16_storage = opt->use_bf16_storage;
    opt_g.use_fp16_packed = opt->use_fp16_packed;
    opt_g.use_fp16_storage = opt->use_fp16_storage;
    opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_g.use_int8_packed = opt->use_int8_packed;
    opt_g.use_int8_storage = opt->use_int8_storage;
    opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_g.use_packing_layout = opt->use_packing_layout;
    uVar9 = opt->vulkan_device_index;
    uVar10 = opt->use_reserved_1;
    uVar12 = opt->use_image_storage;
    uVar14 = opt->use_tensor_storage;
    uVar16 = opt->use_reserved_2;
    uVar15 = CONCAT11(uVar16,uVar14);
    uVar13 = CONCAT21(uVar15,uVar12);
    uVar11 = CONCAT31(uVar13,uVar10);
    uVar17 = opt->flush_denormals;
    uVar18 = opt->use_local_pool_allocator;
    uVar20 = opt->use_shader_local_memory;
    uVar22 = opt->use_cooperative_matrix;
    uVar24 = opt->use_winograd23_convolution;
    uVar23 = CONCAT11(uVar24,uVar22);
    uVar21 = CONCAT21(uVar23,uVar20);
    uVar19 = CONCAT31(uVar21,uVar18);
    uVar25._0_1_ = opt->use_winograd43_convolution;
    uVar25._1_1_ = opt->use_winograd63_convolution;
    uVar25._2_1_ = opt->use_a53_a55_optimized_kernel;
    uVar25._3_1_ = opt->use_fp16_uniform;
    uVar26 = opt->use_int8_uniform;
    uVar27 = opt->use_reserved_9;
    uVar29 = opt->use_reserved_10;
    uVar31 = opt->use_reserved_11;
    uVar30 = CONCAT11(uVar31,uVar29);
    uVar28 = CONCAT21(uVar30,uVar27);
    uVar25._4_4_ = CONCAT31(uVar28,uVar26);
    opt_g._56_4_ = SUB84(uVar25,0);
    opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
    opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
    opt_g.openmp_blocktime = uVar1;
    opt_g._28_4_ = uVar3;
    opt_g.vulkan_device_index = uVar9;
    opt_g._44_4_ = uVar11;
    opt_g.flush_denormals = uVar17;
    opt_g._52_4_ = uVar19;
    opt_g._60_4_ = uVar25._4_4_;
    quantize_to_int8(bottom_blob,&local_100,&this->bottom_blob_int8_scales,&opt_g);
    if ((local_100.data == (void *)0x0) || ((long)local_100.c * local_100.cstep == 0))
    goto LAB_001459b6;
  }
  opt_g.lightmode = false;
  opt_g.use_shader_pack8 = false;
  opt_g.use_subgroup_ops = false;
  opt_g.use_reserved_0 = false;
  opt_g.num_threads = 0;
  opt_g.blob_allocator._0_4_ = 0;
  opt_g.blob_allocator._4_4_ = 0;
  opt_g.workspace_allocator._0_4_ = 0;
  opt_g.workspace_allocator._4_4_ = 0;
  opt_g.openmp_blocktime = 0;
  opt_g.use_bf16_storage = false;
  opt_g.use_fp16_packed = false;
  opt_g.use_fp16_storage = false;
  opt_g.use_fp16_arithmetic = false;
  opt_g.use_int8_packed = false;
  opt_g.use_int8_storage = false;
  opt_g.use_int8_arithmetic = false;
  opt_g.use_packing_layout = false;
  opt_g.vulkan_device_index = 0;
  opt_g.use_reserved_1 = false;
  opt_g.use_image_storage = false;
  opt_g.use_tensor_storage = false;
  opt_g.use_reserved_2 = false;
  opt_g.flush_denormals = 0;
  opt_g.use_local_pool_allocator = false;
  opt_g.use_shader_local_memory = false;
  opt_g.use_cooperative_matrix = false;
  opt_g.use_winograd23_convolution = false;
  opt_g.use_winograd43_convolution = false;
  opt_g.use_winograd63_convolution = false;
  opt_g.use_a53_a55_optimized_kernel = false;
  opt_g.use_fp16_uniform = false;
  make_padding(this,&local_100,(Mat *)&opt_g,opt);
  piVar32 = (int *)CONCAT44(opt_g.blob_allocator._4_4_,opt_g.blob_allocator._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (opt_g._32_8_ == 0) {
        free((void *)opt_g._0_8_);
      }
      else {
        (**(code **)(*(long *)opt_g._32_8_ + 0x18))();
      }
    }
  }
LAB_001459b6:
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (*local_100.refcount == 0) {
      if (local_100.allocator == (Allocator *)0x0) {
        free(local_100.data);
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return -100;
}

Assistant:

int Convolution::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Convolution input %d x %d  ksize=%d %d  stride=%d %d", w, h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scales, opt_g);
        if (bottom_blob_unbordered.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        signed char* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                int sum = 0;

                const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        int val = sptr[space_ofs[k]];
                        int wt = kptr[k];
                        sum += val * wt;
                    }

                    kptr += maxk;
                }

                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

                float sumfp32 = sum * scale_in;

                if (bias_term)
                    sumfp32 += bias_data[p];

                sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                if (use_int8_requantize)
                {
                    // requantize
                    float scale_out = top_blob_int8_scales[0];
                    signed char sums8 = float2int8(sumfp32 * scale_out);
                    outptr[0] = sums8;
                    outptr += 1;
                }
                else
                {
                    // dequantize
                    ((float*)outptr)[0] = sumfp32;
                    outptr += 4;
                }
            }
        }
    }

    return 0;
}